

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  int in_R9D;
  long lVar6;
  bench_inv data;
  int in_stack_fffffffffffff8f8;
  undefined1 local_700 [1744];
  
  pcVar3 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar3 == (char *)0x0) {
    uVar4 = 20000;
  }
  else {
    uVar4 = strtol(pcVar3,(char **)0x0,0);
  }
  if (1 < argc) {
    lVar6 = (ulong)(uint)argc << 3;
    lVar5 = 8;
    do {
      pcVar3 = *(char **)((long)argv + lVar5);
      if (((*pcVar3 == '-') && (pcVar3[1] == 'h')) && (pcVar3[2] == '\0')) goto LAB_00121276;
      lVar5 = lVar5 + 8;
    } while (lVar6 != lVar5);
    lVar5 = 8;
    do {
      if (lVar6 == lVar5) {
        lVar5 = 8;
        goto LAB_00121259;
      }
      iVar1 = strcmp(*(char **)((long)argv + lVar5),"--help");
      lVar5 = lVar5 + 8;
    } while (iVar1 != 0);
    goto LAB_00121276;
  }
LAB_0012133c:
  pcVar3 = "    Max(us)    ";
  printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ");
  putchar(10);
  iVar1 = (int)uVar4;
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_001213b1;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"scalar");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
  goto LAB_001213ca;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"add");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_00121427:
    if ((long)argc * 8 == lVar5) goto LAB_0012145c;
  }
  goto LAB_00121440;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"negate");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_0012149d:
    if ((long)argc * 8 == lVar5) goto LAB_001214d2;
  }
  goto LAB_001214b6;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"mul");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_00121513:
    if ((long)argc * 8 == lVar5) goto LAB_0012154b;
  }
  goto LAB_0012152c;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"split");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_0012158c:
    if ((long)argc * 8 == lVar5) goto LAB_001215c0;
  }
  goto LAB_001215a5;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"inverse");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_00121601:
    if ((long)argc * 8 == lVar5) goto LAB_00121635;
  }
  goto LAB_0012161a;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"inverse");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_00121676:
    if ((long)argc * 8 == lVar5) goto LAB_001216aa;
  }
  goto LAB_0012168f;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"half");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_001216eb:
    if ((long)argc * 8 == lVar5) goto LAB_00121720;
  }
  goto LAB_00121704;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"normalize");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_00121761:
    if ((long)argc * 8 == lVar5) goto LAB_00121796;
  }
  goto LAB_0012177a;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"normalize");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_001217d7:
    if ((long)argc * 8 == lVar5) goto LAB_0012180c;
  }
  goto LAB_001217f0;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"sqr");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_0012184d:
    if ((long)argc * 8 == lVar5) goto LAB_00121885;
  }
  goto LAB_00121866;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"mul");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_001218c6:
    if ((long)argc * 8 == lVar5) goto LAB_001218fe;
  }
  goto LAB_001218df;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"inverse");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_0012193f:
    if ((long)argc * 8 == lVar5) goto LAB_00121973;
  }
  goto LAB_00121958;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"inverse");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_001219b4:
    if ((long)argc * 8 == lVar5) goto LAB_001219e8;
  }
  goto LAB_001219cd;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"issquare");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_00121a29:
    if ((long)argc * 8 == lVar5) goto LAB_00121a5d;
  }
  goto LAB_00121a42;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"sqrt");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_00121a9e:
    if ((long)argc * 8 == lVar5) goto LAB_00121ad2;
  }
  goto LAB_00121ab7;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"double");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_00121b13:
    if ((long)argc * 8 == lVar5) goto LAB_00121b4b;
  }
  goto LAB_00121b2c;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"add");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_00121b8c:
    if ((long)argc * 8 == lVar5) goto LAB_00121bc4;
  }
  goto LAB_00121ba5;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"add");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_00121c05:
    if ((long)argc * 8 == lVar5) goto LAB_00121c3d;
  }
  goto LAB_00121c1e;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"add");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_00121c7e:
    if ((long)argc * 8 == lVar5) goto LAB_00121cb6;
  }
  goto LAB_00121c97;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"add");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_00121cf7:
    if ((long)argc * 8 == lVar5) goto LAB_00121d2f;
  }
  goto LAB_00121d10;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar5),"to_affine");
    lVar5 = lVar5 + 8;
    if (iVar1 == 0) break;
LAB_00121d70:
    if ((long)argc * 8 == lVar5) goto LAB_00121da4;
  }
  goto LAB_00121d89;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar5),"wnaf");
    lVar5 = lVar5 + 8;
    if (iVar1 == 0) break;
LAB_00121de5:
    if ((long)argc * 8 == lVar5) goto LAB_00121e19;
  }
  goto LAB_00121dfe;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar5),"sha256");
    lVar5 = lVar5 + 8;
    if (iVar1 == 0) break;
LAB_00121e5a:
    if ((long)argc * 8 == lVar5) goto LAB_00121e8e;
  }
  goto LAB_00121e73;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar5),"hmac");
    lVar5 = lVar5 + 8;
    if (iVar1 == 0) break;
LAB_00121ecf:
    if ((long)argc * 8 == lVar5) goto LAB_00121f03;
  }
  goto LAB_00121ee8;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar5),"rng6979");
    lVar5 = lVar5 + 8;
    if (iVar1 == 0) break;
LAB_00121f44:
    if ((long)argc * 8 == lVar5) goto LAB_00121f78;
  }
  goto LAB_00121f5d;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar5),"help");
    lVar5 = lVar5 + 8;
    if (iVar1 == 0) break;
LAB_00121259:
    if (lVar6 == lVar5) goto LAB_0012133c;
  }
LAB_00121276:
  puts("Benchmarks various internal routines.");
  putchar(10);
  printf("The default number of iterations for each benchmark is %d. This can be\n",20000);
  puts("customized using the SECP256K1_BENCH_ITERS environment variable.");
  putchar(10);
  puts("Usage: ./bench_internal [args]");
  puts("By default, all benchmarks will be run.");
  puts("args:");
  puts("    help       : display this help and exit");
  puts("    scalar     : all scalar operations (add, half, inverse, mul, negate, split)");
  puts("    field      : all field operations (half, inverse, issquare, mul, normalize, sqr, sqrt)")
  ;
  puts("    group      : all group operations (add, double, to_affine)");
  puts("    ecmult     : all point multiplication operations (ecmult_wnaf) ");
  puts("    hash       : all hash algorithms (hmac, rng6979, sha256)");
  puts("    context    : all context object operations (context_create)");
  putchar(10);
  return 0;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"half");
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_001213b1:
    if ((long)argc * 8 == lVar5) goto LAB_001213e6;
  }
LAB_001213ca:
  run_benchmark("scalar_half",bench_scalar_half,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_001213e6:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121427;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"scalar");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_00121440:
  run_benchmark("scalar_add",bench_scalar_add,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_0012145c:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_0012149d;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"scalar");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_001214b6:
  run_benchmark("scalar_negate",bench_scalar_negate,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_001214d2:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121513;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"scalar");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_0012152c:
  run_benchmark("scalar_mul",bench_scalar_mul,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_0012154b:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_0012158c;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"scalar");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_001215a5:
  run_benchmark("scalar_split",bench_scalar_split,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_001215c0:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121601;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"scalar");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_0012161a:
  run_benchmark("scalar_inverse",bench_scalar_inverse,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121635:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121676;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"scalar");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_0012168f:
  run_benchmark("scalar_inverse_var",bench_scalar_inverse_var,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_001216aa:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_001216eb;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"field");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_00121704:
  run_benchmark("field_half",bench_field_half,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121720:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121761;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"field");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_0012177a:
  run_benchmark("field_normalize",bench_field_normalize,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121796:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_001217d7;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"field");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_001217f0:
  run_benchmark("field_normalize_weak",bench_field_normalize_weak,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_0012180c:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_0012184d;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"field");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_00121866:
  run_benchmark("field_sqr",bench_field_sqr,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121885:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_001218c6;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"field");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_001218df:
  run_benchmark("field_mul",bench_field_mul,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_001218fe:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_0012193f;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"field");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_00121958:
  run_benchmark("field_inverse",bench_field_inverse,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121973:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_001219b4;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"field");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_001219cd:
  run_benchmark("field_inverse_var",bench_field_inverse_var,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_001219e8:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121a29;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"field");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_00121a42:
  run_benchmark("field_is_square_var",bench_field_is_square_var,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121a5d:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121a9e;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"field");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_00121ab7:
  run_benchmark("field_sqrt",bench_field_sqrt,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121ad2:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121b13;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"group");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_00121b2c:
  run_benchmark("group_double_var",bench_group_double_var,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121b4b:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121b8c;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"group");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_00121ba5:
  run_benchmark("group_add_var",bench_group_add_var,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121bc4:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121c05;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"group");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_00121c1e:
  run_benchmark("group_add_affine",bench_group_add_affine,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121c3d:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121c7e;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"group");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_00121c97:
  run_benchmark("group_add_affine_var",bench_group_add_affine_var,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121cb6:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121cf7;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"group");
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_00121d10:
  run_benchmark("group_add_zinv_var",bench_group_add_zinv_var,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121d2f:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121d70;
      }
      iVar1 = strcmp(*(char **)((long)argv + lVar5),"group");
      lVar5 = lVar5 + 8;
    } while (iVar1 != 0);
  }
LAB_00121d89:
  run_benchmark("group_to_affine_var",bench_group_to_affine_var,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121da4:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121de5;
      }
      iVar1 = strcmp(*(char **)((long)argv + lVar5),"ecmult");
      lVar5 = lVar5 + 8;
    } while (iVar1 != 0);
  }
LAB_00121dfe:
  run_benchmark("ecmult_wnaf",bench_ecmult_wnaf,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121e19:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121e5a;
      }
      iVar1 = strcmp(*(char **)((long)argv + lVar5),"hash");
      lVar5 = lVar5 + 8;
    } while (iVar1 != 0);
  }
LAB_00121e73:
  run_benchmark("hash_sha256",bench_sha256,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121e8e:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121ecf;
      }
      iVar1 = strcmp(*(char **)((long)argv + lVar5),"hash");
      lVar5 = lVar5 + 8;
    } while (iVar1 != 0);
  }
LAB_00121ee8:
  run_benchmark("hash_hmac_sha256",bench_hmac_sha256,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
LAB_00121f03:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        lVar5 = 8;
        goto LAB_00121f44;
      }
      iVar1 = strcmp(*(char **)((long)argv + lVar5),"hash");
      lVar5 = lVar5 + 8;
    } while (iVar1 != 0);
  }
LAB_00121f5d:
  run_benchmark("hash_rfc6979_hmac_sha256",bench_rfc6979_hmac_sha256,
                (_func_void_void_ptr *)local_700,(_func_void_void_ptr_int *)(uVar4 & 0xffffffff),
                pcVar3,in_R9D,in_stack_fffffffffffff8f8);
LAB_00121f78:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if ((long)argc * 8 == lVar5) {
        return 0;
      }
      iVar1 = strcmp(*(char **)((long)argv + lVar5),"context");
      lVar5 = lVar5 + 8;
    } while (iVar1 != 0);
  }
  run_benchmark("context_create",bench_context,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                in_stack_fffffffffffff8f8);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    bench_inv data;
    int default_iters = 20000;
    int iters = get_iters(default_iters);
    int d = argc == 1; /* default */

    if (argc > 1) {
        if (have_flag(argc, argv, "-h")
           || have_flag(argc, argv, "--help")
           || have_flag(argc, argv, "help")) {
            help(default_iters);
            return EXIT_SUCCESS;
        }
    }

    print_output_table_header_row();

    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "half")) run_benchmark("scalar_half", bench_scalar_half, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "add")) run_benchmark("scalar_add", bench_scalar_add, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "negate")) run_benchmark("scalar_negate", bench_scalar_negate, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "mul")) run_benchmark("scalar_mul", bench_scalar_mul, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "split")) run_benchmark("scalar_split", bench_scalar_split, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "inverse")) run_benchmark("scalar_inverse", bench_scalar_inverse, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "inverse")) run_benchmark("scalar_inverse_var", bench_scalar_inverse_var, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "half")) run_benchmark("field_half", bench_field_half, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "normalize")) run_benchmark("field_normalize", bench_field_normalize, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "normalize")) run_benchmark("field_normalize_weak", bench_field_normalize_weak, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "sqr")) run_benchmark("field_sqr", bench_field_sqr, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "mul")) run_benchmark("field_mul", bench_field_mul, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "inverse")) run_benchmark("field_inverse", bench_field_inverse, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "inverse")) run_benchmark("field_inverse_var", bench_field_inverse_var, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "issquare")) run_benchmark("field_is_square_var", bench_field_is_square_var, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "sqrt")) run_benchmark("field_sqrt", bench_field_sqrt, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "double")) run_benchmark("group_double_var", bench_group_double_var, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "add")) run_benchmark("group_add_var", bench_group_add_var, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "add")) run_benchmark("group_add_affine", bench_group_add_affine, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "add")) run_benchmark("group_add_affine_var", bench_group_add_affine_var, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "add")) run_benchmark("group_add_zinv_var", bench_group_add_zinv_var, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "to_affine")) run_benchmark("group_to_affine_var", bench_group_to_affine_var, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "ecmult") || have_flag(argc, argv, "wnaf")) run_benchmark("ecmult_wnaf", bench_ecmult_wnaf, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "hash") || have_flag(argc, argv, "sha256")) run_benchmark("hash_sha256", bench_sha256, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "hash") || have_flag(argc, argv, "hmac")) run_benchmark("hash_hmac_sha256", bench_hmac_sha256, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "hash") || have_flag(argc, argv, "rng6979")) run_benchmark("hash_rfc6979_hmac_sha256", bench_rfc6979_hmac_sha256, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "context")) run_benchmark("context_create", bench_context, bench_setup, NULL, &data, 10, iters);

    return EXIT_SUCCESS;
}